

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

bool Diligent::
     CreateTestGLTexture<Diligent::RenderDeviceGLImpl::TestTextureFormat(Diligent::TEXTURE_FORMAT)::__2>
               (GLContextState *GlCtxState,GLenum BindTarget,GLTextureObj *GLTexObj,
               anon_class_8_1_a6261488 CreateFunc)

{
  GLenum BindTarget_00;
  GLContextState *this;
  int iVar1;
  GLTextureCreateReleaseHelper local_3c;
  GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper> local_38;
  byte local_29;
  GLTextureObj *pGStack_28;
  bool bSuccess;
  GLTextureObj *GLTexObj_local;
  GLContextState *pGStack_18;
  GLenum BindTarget_local;
  GLContextState *GlCtxState_local;
  anon_class_8_1_a6261488 CreateFunc_local;
  
  pGStack_28 = GLTexObj;
  GLTexObj_local._4_4_ = BindTarget;
  pGStack_18 = GlCtxState;
  GlCtxState_local = (GLContextState *)CreateFunc.GLFmt;
  GLContextState::BindTexture(GlCtxState,-1,BindTarget,GLTexObj);
  RenderDeviceGLImpl::TestTextureFormat::anon_class_8_1_a6261488::operator()
            ((anon_class_8_1_a6261488 *)&GlCtxState_local);
  iVar1 = glGetError();
  this = pGStack_18;
  BindTarget_00 = GLTexObj_local._4_4_;
  local_29 = iVar1 == 0;
  GLObjectWrappers::GLTextureCreateReleaseHelper::GLTextureCreateReleaseHelper(&local_3c,0);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::GLObjWrapper
            (&local_38,false,local_3c);
  GLContextState::BindTexture(this,-1,BindTarget_00,&local_38);
  GLObjectWrappers::GLObjWrapper<GLObjectWrappers::GLTextureCreateReleaseHelper>::~GLObjWrapper
            (&local_38);
  return (bool)(local_29 & 1);
}

Assistant:

bool CreateTestGLTexture(GLContextState& GlCtxState, GLenum BindTarget, const GLObjectWrappers::GLTextureObj& GLTexObj, CreateFuncType CreateFunc)
{
    GlCtxState.BindTexture(-1, BindTarget, GLTexObj);
    CreateFunc();
    bool bSuccess = glGetError() == GL_NO_ERROR;
    GlCtxState.BindTexture(-1, BindTarget, GLObjectWrappers::GLTextureObj{false});
    return bSuccess;
}